

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
::sherwood_v3_table(sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
                    *this,StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>
                          *alloc)

{
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>
  *psVar1;
  
  (this->
  super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>
  ).storage = alloc->storage;
  psVar1 = empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PatternVarSymbol_const*>>
                     ();
  this->entries = psVar1;
  this->num_slots_minus_one = 0;
  this->hash_policy = '?';
  this->max_lookups = '\x03';
  this->_max_load_factor = 0.5;
  this->num_elements = 0;
  return;
}

Assistant:

explicit sherwood_v3_table(const ArgumentAlloc & alloc)
        : EntryAlloc(alloc)
    {
    }